

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetStringRaw
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,StringRefType *s,
          CrtAllocator *allocator)

{
  SizeType SVar1;
  uint uVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *__dest;
  ulong __n;
  
  if (s->length < 0xe) {
    (this->data_).f.flags = 0x1c05;
    (this->data_).ss.str[0xd] = '\r' - (char)s->length;
    memmove(this,s->s,(ulong)s->length);
    __n = (ulong)s->length;
    __dest = this;
  }
  else {
    (this->data_).f.flags = 0xc05;
    SVar1 = s->length;
    (this->data_).s.length = SVar1;
    uVar2 = SVar1 + 1;
    if (uVar2 == 0) {
      __dest = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)0x0;
    }
    else {
      __dest = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)malloc((ulong)uVar2);
    }
    (this->data_).s.str = (Ch *)((ulong)(this->data_).f.flags << 0x30 | (ulong)__dest);
    __n = (ulong)s->length;
    memcpy(__dest,s->s,__n);
  }
  *(undefined1 *)((long)&__dest->data_ + __n) = 0;
  return;
}

Assistant:

void SetStringRaw(StringRefType s, Allocator& allocator) {
        Ch* str = 0;
        if (ShortString::Usable(s.length)) {
            data_.f.flags = kShortStringFlag;
            data_.ss.SetLength(s.length);
            str = data_.ss.str;
            std::memmove(str, s, s.length * sizeof(Ch));
        } else {
            data_.f.flags = kCopyStringFlag;
            data_.s.length = s.length;
            str = static_cast<Ch *>(allocator.Malloc((s.length + 1) * sizeof(Ch)));
            SetStringPointer(str);
            std::memcpy(str, s, s.length * sizeof(Ch));
        }
        str[s.length] = '\0';
    }